

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> * __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
::GetUnusedHeapBlock
          (HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
           *this)

{
  uint32 *puVar1;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_00;
  code *pcVar2;
  bool bVar3;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *pSVar4;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *pSVar5;
  undefined4 *puVar6;
  
  pSVar5 = this->emptyBlockList;
  if (pSVar5 == (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    pSVar5 = SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>::New(this);
    if ((this->super_HeapBucket).emptyHeapBlockCount != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x2fd,"(this->emptyHeapBlockCount == 0)","this->emptyHeapBlockCount == 0")
      ;
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
  }
  else {
    this_00 = (pSVar5->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
              super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
              super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
    if (this_00 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      pSVar4 = (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    }
    else {
      pSVar4 = HeapBlock::AsFinalizableWriteBarrierBlock<SmallAllocationBlockAttributes>
                         (&this_00->super_HeapBlock);
    }
    this->emptyBlockList = pSVar4;
    puVar1 = &(this->super_HeapBucket).emptyHeapBlockCount;
    *puVar1 = *puVar1 - 1;
  }
  return pSVar5;
}

Assistant:

TBlockType*
HeapBucketT<TBlockType>::GetUnusedHeapBlock()
{
    // Add a new heap block
    TBlockType * heapBlock = emptyBlockList;
    if (heapBlock == nullptr)
    {
        // We couldn't find a reusable heap block
        heapBlock = TBlockType::New(this);
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
        Assert(this->emptyHeapBlockCount == 0);
#endif
    }
    else
    {
        emptyBlockList = heapBlock->GetNextBlock();
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
        this->emptyHeapBlockCount--;
#endif
    }
    return heapBlock;
}